

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O1

_Bool olsrv2_mpr_shall_forwarding
                (rfc5444_reader_tlvblock_context *context,netaddr *source_address,uint64_t vtime)

{
  netaddr *originator;
  byte bVar1;
  oonf_rfc5444_interface *poVar2;
  long lVar3;
  oonf_rfc5444_protocol *poVar4;
  int iVar5;
  oonf_duplicate_result oVar6;
  avl_tree *tree;
  avl_node *paVar7;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  oonf_log_source oVar12;
  char *pcVar13;
  netaddr_str buf;
  
  poVar4 = _protocol;
  oVar12 = LOG_OLSRV2;
  if ((context->has_origaddr == true) && (context->has_seqno != false)) {
    poVar2 = (_protocol->input).interface;
    if (poVar2 == (oonf_rfc5444_interface *)0x0) {
      if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
        pcVar10 = "Do not forward because input interface is not set";
        iVar5 = 0x1c1;
        goto LAB_0013196f;
      }
    }
    else if (source_address == (netaddr *)0x0) {
      if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
        pcVar10 = "Do not forward because input source is not set";
        iVar5 = 0x1c7;
        goto LAB_0013196f;
      }
    }
    else {
      iVar5 = strcmp(poVar2->name,"any");
      if (iVar5 != 0) {
        originator = &context->orig_addr;
        oVar6 = oonf_duplicate_entry_add
                          (&poVar4->forwarded_set,context->msg_type,originator,(ulong)context->seqno
                           ,vtime + _olsrv2_config.f_hold_time);
        oVar12 = LOG_OLSRV2;
        if ((oVar6 < (OONF_DUPSET_NEWEST|OONF_DUPSET_NEW)) && ((0x34U >> (oVar6 & 0x1f) & 1) != 0))
        {
          poVar2 = (_protocol->input).interface;
          tree = nhdp_interface_get_tree();
          paVar7 = avl_find(tree,poVar2);
          if (paVar7 == (avl_node *)0x0) {
            if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
              pcVar10 = "Do not forward because NHDP does not handle interface \'%s\'";
              iVar5 = 0x1e1;
              oVar12 = LOG_OLSRV2;
              goto LAB_0013196f;
            }
          }
          else {
            paVar7 = avl_find((avl_tree *)(paVar7 + 2),source_address);
            oVar12 = LOG_OLSRV2;
            if (paVar7 == (avl_node *)0x0) {
              if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
                netaddr_to_prefixstring(&buf,source_address,false);
                pcVar10 = "Do not forward because source IP %s is not a direct neighbor";
                iVar5 = 0x1eb;
                goto LAB_0013196f;
              }
            }
            else {
              pvVar8 = paVar7[-3].key;
              if (((context->orig_addr)._type == source_address->_type) ||
                 (pvVar8 = *(void **)((long)pvVar8 + 0x140), pvVar8 != (void *)0x0)) {
                lVar3 = *(long *)((long)pvVar8 + 0x148);
                if (*(char *)((long)paVar7[-3].key + 0x180) == '\x01') {
                  bVar11 = 0 < *(int *)(lVar3 + 0x14);
                }
                else {
                  bVar11 = false;
                }
                if ((log_global_mask[LOG_OLSRV2] & 1) == 0) {
                  return bVar11;
                }
                pcVar10 = "not ";
                if (bVar11 != false) {
                  pcVar10 = "";
                }
                bVar1 = context->msg_type;
                pcVar9 = netaddr_to_prefixstring(&buf,originator,false);
                pcVar13 = "false";
                if (*(char *)((long)paVar7[-3].key + 0x180) != '\0') {
                  pcVar13 = "true";
                }
                oonf_log(LOG_SEVERITY_DEBUG,oVar12,"src/olsrv2/olsrv2/olsrv2.c",0x205,(void *)0x0,0,
                         "Do %sforward message type %u from %s with seqno %u (%s/%u)",pcVar10,
                         (ulong)bVar1,pcVar9,(ulong)context->seqno,pcVar13,
                         (ulong)*(uint *)(lVar3 + 0x14));
                return bVar11;
              }
              if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
                netaddr_to_prefixstring(&buf,source_address,false);
                pcVar10 = 
                "Do not forward because this is a dualstack message, but the link source %s is not dualstack capable"
                ;
                iVar5 = 0x1fb;
LAB_0013196f:
                oonf_log(LOG_SEVERITY_DEBUG,oVar12,"src/olsrv2/olsrv2/olsrv2.c",iVar5,(void *)0x0,0,
                         pcVar10);
                return false;
              }
            }
          }
        }
        else if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
          bVar1 = context->msg_type;
          pcVar10 = netaddr_to_prefixstring(&buf,originator,false);
          oonf_log(LOG_SEVERITY_DEBUG,oVar12,"src/olsrv2/olsrv2/olsrv2.c",0x1d7,(void *)0x0,0,
                   "Do not forward message type %u from %s with seqno %u (dupset result: %u)",
                   (ulong)bVar1,pcVar10,(ulong)context->seqno,(ulong)oVar6);
          return false;
        }
      }
    }
  }
  else if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
    pcVar10 = "Do not forward message type %u, originator or sequence number is missing!";
    iVar5 = 0x1bb;
    goto LAB_0013196f;
  }
  return false;
}

Assistant:

bool
olsrv2_mpr_shall_forwarding(
  struct rfc5444_reader_tlvblock_context *context, struct netaddr *source_address, uint64_t vtime) {
  struct nhdp_interface *interf;
  struct nhdp_laddr *laddr;
  struct nhdp_neighbor *neigh;
  enum oonf_duplicate_result dup_result;
  bool forward;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  /* check if message has originator and sequence number */
  if (!context->has_origaddr || !context->has_seqno) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u,"
      " originator or sequence number is missing!",
      context->msg_type);
    return false;
  }

  /* check input interface */
  if (_protocol->input.interface == NULL) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input interface is not set");
    return false;
  }

  /* check input source address */
  if (!source_address) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input source is not set");
    return false;
  }

  /* check if this is coming from the unicast receiver */
  if (strcmp(_protocol->input.interface->name, RFC5444_UNICAST_INTERFACE) == 0) {
    return false;
  }

  /* check forwarding set */
  dup_result = oonf_duplicate_entry_add(&_protocol->forwarded_set, context->msg_type, &context->orig_addr,
    context->seqno, vtime + _olsrv2_config.f_hold_time);
  if (!oonf_duplicate_is_new(dup_result)) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u from %s"
      " with seqno %u (dupset result: %u)",
      context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno, dup_result);
    return false;
  }

  /* get NHDP interface */
  interf = nhdp_interface_get(_protocol->input.interface->name);
  if (interf == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because NHDP does not handle"
      " interface '%s'",
      _protocol->input.interface->name);
    return false;
  }

  /* get NHDP link address corresponding to source */
  laddr = nhdp_interface_get_link_addr(interf, source_address);
  if (laddr == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because source IP %s is"
      " not a direct neighbor",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  if (netaddr_get_address_family(&context->orig_addr) == netaddr_get_address_family(source_address)) {
    /* get NHDP neighbor */
    neigh = laddr->link->neigh;
  }
  else if (laddr->link->dualstack_partner) {
    /* get dualstack NHDP neighbor */
    neigh = laddr->link->dualstack_partner->neigh;
  }
  else {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because this is a dualstack"
      " message, but the link source %s is not dualstack capable",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  /* forward if this neighbor has selected us as a flooding MPR */
  forward = laddr->link->local_is_flooding_mpr && neigh->symmetric > 0;
  OONF_DEBUG(LOG_OLSRV2,
    "Do %sforward message type %u from %s"
    " with seqno %u (%s/%u)",
    forward ? "" : "not ", context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno,
    laddr->link->local_is_flooding_mpr ? "true" : "false", neigh->symmetric);
  return forward;
}